

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_query_square_flag(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  char local_15;
  wchar_t local_14;
  char c;
  command_conflict *pcStack_10;
  wchar_t flag;
  command_conflict *cmd_local;
  
  local_14 = L'\0';
  pcStack_10 = cmd;
  wVar2 = cmd_get_arg_choice((command *)cmd,"choice",&local_14);
  if (wVar2 != L'\0') {
    _Var1 = get_com("Debug Command Query [grasvwdftniolx]: ",&local_15);
    if (!_Var1) {
      return;
    }
    switch(local_15) {
    case 'a':
      local_14 = L'\x03';
      break;
    case 'd':
      local_14 = L'\x13';
      break;
    case 'f':
      local_14 = L'\b';
      break;
    case 'g':
      local_14 = L'\x02';
      break;
    case 'i':
      local_14 = L'\v';
      break;
    case 'l':
      local_14 = L'\r';
      break;
    case 'n':
      local_14 = L'\n';
      break;
    case 'o':
      local_14 = L'\f';
      break;
    case 'r':
      local_14 = L'\x04';
      break;
    case 's':
      local_14 = L'\x05';
      break;
    case 't':
      local_14 = L'\t';
      break;
    case 'v':
      local_14 = L'\x06';
      break;
    case 'w':
      local_14 = L'\a';
      break;
    case 'x':
      local_14 = L'\x0e';
    }
    cmd_set_arg_choice((command *)pcStack_10,"choice",local_14);
  }
  wiz_hack_map((chunk *)cave,player,wiz_hack_map_query_square_flag,&local_14);
  Term_redraw();
  msg("Press any key.");
  inkey_ex();
  prt("",L'\0',L'\0');
  prt_map();
  return;
}

Assistant:

void do_cmd_wiz_query_square_flag(struct command *cmd)
{
	int flag = 0;

	if (cmd_get_arg_choice(cmd, "choice", &flag) != CMD_OK) {
		char c;

		if (!get_com("Debug Command Query [grasvwdftniolx]: ", &c))
			return;
		switch (c) {
			case 'g': flag = SQUARE_GLOW; break;
			case 'r': flag = SQUARE_ROOM; break;
			case 'a': flag = SQUARE_VAULT; break;
			case 's': flag = SQUARE_SEEN; break;
			case 'v': flag = SQUARE_VIEW; break;
			case 'w': flag = SQUARE_WASSEEN; break;
			case 'd': flag = SQUARE_DTRAP; break;
			case 'f': flag = SQUARE_FEEL; break;
			case 't': flag = SQUARE_TRAP; break;
			case 'n': flag = SQUARE_INVIS; break;
			case 'i': flag = SQUARE_WALL_INNER; break;
			case 'o': flag = SQUARE_WALL_OUTER; break;
			case 'l': flag = SQUARE_WALL_SOLID; break;
			case 'x': flag = SQUARE_MON_RESTRICT; break;
		}
		cmd_set_arg_choice(cmd, "choice", flag);
	}

	wiz_hack_map(cave, player, wiz_hack_map_query_square_flag, &flag);

	Term_redraw();

	msg("Press any key.");
	inkey_ex();
	prt("", 0, 0);

	/* Redraw map */
	prt_map();
}